

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-status.c
# Opt level: O0

int labpack_status_code(labpack_status_t status)

{
  int local_c;
  labpack_status_t status_local;
  
  switch(status) {
  case LABPACK_STATUS_OK:
    local_c = 0;
    break;
  case LABPACK_STATUS_ERROR_OUT_OF_MEMORY:
    local_c = -1;
    break;
  case LABPACK_STATUS_ERROR_NULL_VALUE:
    local_c = -2;
    break;
  case LABPACK_STATUS_ERROR_ENCODER:
    local_c = -3;
    break;
  case LABPACK_STATUS_ERROR_DECODER:
    local_c = -4;
    break;
  default:
    if (UNKNOWN_STATUS == (char *)0x0) {
      __assert_fail("UNKNOWN_STATUS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-status.c"
                    ,0x31,"int labpack_status_code(labpack_status_t)");
    }
    local_c = 1;
  }
  return local_c;
}

Assistant:

int
labpack_status_code(labpack_status_t status) {
    switch (status) {
        case LABPACK_STATUS_OK: return 0;
        case LABPACK_STATUS_ERROR_OUT_OF_MEMORY: return -1;
        case LABPACK_STATUS_ERROR_NULL_VALUE: return -2;                                     
        case LABPACK_STATUS_ERROR_ENCODER: return -3;
        case LABPACK_STATUS_ERROR_DECODER: return -4;
        default: assert(UNKNOWN_STATUS);
    }
    return 1;
}